

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O1

void load(int r,SValue *sv)

{
  ushort uVar1;
  uint64_t uVar2;
  SValue *pSVar3;
  int iVar4;
  uint r2;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *fmt;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  bool bVar12;
  undefined1 local_98 [8];
  SValue v1;
  int local_50;
  uint local_4c;
  int align;
  ulong local_40;
  SValue *local_38;
  
  uVar1 = sv->r;
  uVar5 = (uint)uVar1;
  uVar10 = (sv->c).i;
  uVar6 = (uint)uVar10;
  uVar11 = (uint64_t)(int)uVar6;
  if ((uVar1 >> 9 & 1) != 0 && uVar11 != uVar10) {
    fmt = "64 bit addend in load";
LAB_001274f2:
    tcc_error(fmt);
  }
  uVar7 = (ulong)(uint)r;
  uVar8 = (sv->type).t;
  uVar9 = uVar8 & 0xfffffcdf;
  local_38 = sv;
  if (((uVar1 & 0x33f) == 0x330) && (((sv->sym->type).t & 0x2000) == 0)) {
    local_4c = uVar8;
    local_40 = (ulong)uVar1;
    iVar4 = is_float(uVar9);
    _align = uVar7;
    if (iVar4 != 0) {
      r = get_reg(1);
    }
    sv = local_38;
    gen_modrm64(0x8b,r | 0x20,(int)local_40,local_38->sym,0);
    uVar5 = r | 0x120;
    uVar7 = _align;
    uVar8 = local_4c;
  }
  pSVar3 = local_38;
  r2 = uVar5 & 0x3f;
  if ((uVar5 >> 8 & 1) == 0) {
    uVar9 = (uint)uVar7;
    if (r2 == 0x33) {
      orex(0,uVar9,0,0);
      uVar5 = uVar9 & 7;
      oad(uVar5 + 0xb8,(uint)((uVar6 & 0xfffffeff) == 0x95));
      if ((uVar6 >> 8 & 1) != 0) {
        uVar8 = (uVar9 & 8) * 0x20 + 0x37a;
        do {
          g(uVar8);
          bVar12 = 0xff < uVar8;
          uVar8 = uVar8 >> 8;
        } while (bVar12);
        uVar10 = (uint64_t)(uVar6 & 0xfffffeff);
      }
      orex(0,uVar9,0,0xf);
      if ((int)uVar10 != 0) {
        uVar7 = uVar10 & 0xffffffff;
        do {
          uVar6 = (uint)uVar10;
          g(uVar6);
          uVar7 = uVar7 >> 8;
          uVar10 = uVar7;
        } while (0xff < uVar6);
      }
    }
    else {
      if (r2 == 0x32) {
        orex(1,0,uVar9,0x8d);
        gen_modrm_impl(uVar9,0x32,local_38->sym,uVar6,0);
        return;
      }
      if (r2 == 0x30) {
        if ((uVar5 >> 9 & 1) != 0) {
          iVar4 = (uVar9 & 7) * 8 + 5;
          if (((local_38->sym->type).t & 0x2000) == 0) {
            orex(1,0,uVar9,0x8b);
            g(iVar4);
            gen_gotpcrel(uVar9,pSVar3->sym,uVar6);
            return;
          }
          orex(1,0,uVar9,0x8d);
          g(iVar4);
          gen_addrpc32(uVar5,pSVar3->sym,uVar6);
          return;
        }
        uVar5 = uVar9 & 7 | 0xb8;
        if ((uVar8 & 0xf) - 7 < 0xfffffffd) {
          orex(0,uVar9,0,uVar5);
          gen_le32(uVar6);
          return;
        }
        orex(1,uVar9,0,uVar5);
        gen_le64((local_38->c).i);
        return;
      }
      if ((uVar5 & 0x3e) == 0x34) {
        orex(0,uVar9,0,0);
        uVar8 = uVar9 & 7 | 0xb8;
        local_40 = (ulong)(uVar5 & 1);
        oad(uVar8,uVar5 & 1);
        uVar5 = (uVar9 & 8) * 0x20 + 0x5eb;
        do {
          g(uVar5);
          bVar12 = 0xff < uVar5;
          uVar5 = uVar5 >> 8;
        } while (bVar12);
        gsym_addr(uVar6,ind);
        orex(0,uVar9,0,0);
        oad(uVar8,(uint)local_40 ^ 1);
        return;
      }
      if (r2 == uVar9) {
        return;
      }
      if ((uVar9 & 0xfffffff8) == 0x10) {
        if (r2 == 0x18) {
          uVar5 = 0xf0245cdd;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          uVar5 = 0x100ff2;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          g((uVar9 & 7) * 8 + 0x44);
          uVar5 = 0xf024;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          return;
        }
        if ((uVar5 & 0x38) == 0x10) {
          if ((uVar8 & 0xf) == 8) {
            uVar6 = 0x100ff3;
            do {
              g(uVar6);
              bVar12 = 0xff < uVar6;
              uVar6 = uVar6 >> 8;
            } while (bVar12);
          }
          else {
            if ((uVar8 & 0xf) != 9) {
              __assert_fail("(ft & VT_BTYPE) == VT_DOUBLE",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                            ,499,"void load(int, SValue *)");
            }
            uVar6 = 0x100ff2;
            do {
              g(uVar6);
              bVar12 = 0xff < uVar6;
              uVar6 = uVar6 >> 8;
            } while (bVar12);
          }
          uVar5 = (uVar5 & 7) + uVar9 * 8 | 0xc0;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = 0;
          } while (bVar12);
          return;
        }
        __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                      ,0x1ef,"void load(int, SValue *)");
      }
      if (uVar9 == 0x18) {
        if ((uVar5 & 0x38) == 0x10) {
          uVar5 = 0x110ff2;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          g(0x44);
          uVar5 = 0xf024;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          uVar5 = 0xf02444dd;
          do {
            g(uVar5);
            bVar12 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar12);
          return;
        }
        __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                      ,0x1f9,"void load(int, SValue *)");
      }
      orex(1,uVar9,r2,0x89);
      uVar5 = (uVar9 & 7) + (uVar5 & 0x1f) * 8;
    }
    g(uVar5 | 0xc0);
    return;
  }
  if (r2 == 0x31) {
    local_98._0_4_ = 5;
    v1.type.ref._0_2_ = 0x132;
    v1._24_8_ = uVar11;
    _align = uVar7;
    if ((0x1fff7f8UL >> (uVar7 & 0x3f) & 1) != 0) {
      uVar5 = get_reg(1);
      uVar7 = (ulong)uVar5;
    }
    uVar5 = (uint)uVar7;
    load(uVar5,(SValue *)local_98);
    uVar7 = _align;
    sv = local_38;
  }
  uVar6 = (uint)uVar7;
  uVar2 = (sv->c).i;
  if (uVar11 != uVar2) {
    local_98._0_4_ = 4;
    v1.type.ref._0_2_ = 0x30;
    uVar5 = uVar6;
    v1._24_8_ = uVar2;
    if ((0x1fff7f8UL >> (uVar7 & 0x3f) & 1) != 0) {
      uVar5 = get_reg(1);
    }
    load(uVar5,(SValue *)local_98);
    uVar10 = 0;
    sv = local_38;
  }
  if ((uVar8 & 0xf) == 7) {
    iVar4 = type_size(&sv->type,&local_50);
    uVar8 = iVar4 - 1;
    if ((7 < uVar8) || ((0x8bU >> (uVar8 & 0x1f) & 1) == 0)) {
      fmt = "invalid aggregate type for register load";
      goto LAB_001274f2;
    }
    uVar9 = *(uint *)(&DAT_00131140 + (ulong)uVar8 * 4);
    sv = local_38;
  }
  uVar8 = uVar9 & 0xf;
  bVar12 = true;
  if (uVar8 == 10) {
    iVar4 = 0xdb;
    uVar6 = 5;
  }
  else if (uVar8 == 9) {
    uVar6 = uVar6 & 7;
    iVar4 = 0x7e0ff3;
  }
  else if (uVar8 == 8) {
    uVar6 = uVar6 & 7;
    iVar4 = 0x6e0f66;
  }
  else {
    uVar9 = uVar9 & 0xf0f7f;
    iVar4 = 0xbe0f;
    if (uVar9 < 0xb) {
      if (uVar9 == 1) goto LAB_0012716c;
      if (uVar9 == 2) {
        iVar4 = 0xbf0f;
        goto LAB_0012716c;
      }
    }
    else {
      if (uVar9 == 0xb) goto LAB_0012716c;
      if (uVar9 == 0x12) {
        iVar4 = 0xb70f;
        goto LAB_0012716c;
      }
      if (uVar9 == 0x11) {
        iVar4 = 0xb60f;
        goto LAB_0012716c;
      }
    }
    if (3 < uVar8 - 3) {
      __assert_fail("((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) || ((ft & VT_BTYPE) == VT_FUNC)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                    ,0x1a7,"void load(int, SValue *)");
    }
    bVar12 = uVar8 - 7 < 0xfffffffd;
    iVar4 = 0x8b;
  }
LAB_0012716c:
  if (bVar12) {
    orex(0,uVar5,uVar6,iVar4);
    gen_modrm_impl(uVar6,uVar5,sv->sym,(int)uVar10,0);
  }
  else {
    gen_modrm64(iVar4,uVar6,uVar5,sv->sym,(int)uVar10);
  }
  return;
}

Assistant:

void load(int r, SValue* sv) {
  int v, t, ft, fc, fr;
  SValue v1;

#ifdef TCC_TARGET_PE
  SValue v2;
  sv = pe_getimport(sv, &v2);
#endif

  fr = sv->r;
  ft = sv->type.t & ~VT_DEFSIGN;
  fc = sv->c.i;
  if (fc != sv->c.i && (fr & VT_SYM))
    tcc_error("64 bit addend in load");

  ft &= ~(VT_VOLATILE | VT_CONSTANT);

#ifndef TCC_TARGET_PE
  /* we use indirect access via got */
  if ((fr & VT_VALMASK) == VT_CONST && (fr & VT_SYM) && (fr & VT_LVAL) && !(sv->sym->type.t & VT_STATIC)) {
    /* use the result register as a temporal register */
    int tr = r | TREG_MEM;
    if (is_float(ft)) {
      /* we cannot use float registers as a temporal register */
      tr = get_reg(RC_INT) | TREG_MEM;
    }
    gen_modrm64(0x8b, tr, fr, sv->sym, 0);

    /* load from the temporal register */
    fr = tr | VT_LVAL;
  }
#endif

  v = fr & VT_VALMASK;
  if (fr & VT_LVAL) {
    int b, ll;
    if (v == VT_LLOCAL) {
      v1.type.t = VT_PTR;
      v1.r = VT_LOCAL | VT_LVAL;
      v1.c.i = fc;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
    }
    if (fc != sv->c.i) {
      /* If the addends doesn't fit into a 32bit signed
         we must use a 64bit move.  We've checked above
         that this doesn't have a sym associated.  */
      v1.type.t = VT_LLONG;
      v1.r = VT_CONST;
      v1.c.i = sv->c.i;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
      fc = 0;
    }
    ll = 0;
    /* Like GCC we can load from small enough properly sized
       structs and unions as well.
       XXX maybe move to generic operand handling, but should
       occur only with asm, so tccasm.c might also be a better place */
    if ((ft & VT_BTYPE) == VT_STRUCT) {
      int align;
      switch (type_size(&sv->type, &align)) {
        case 1:
          ft = VT_BYTE;
          break;
        case 2:
          ft = VT_SHORT;
          break;
        case 4:
          ft = VT_INT;
          break;
        case 8:
          ft = VT_LLONG;
          break;
        default:
          tcc_error("invalid aggregate type for register load");
          break;
      }
    }
    if ((ft & VT_BTYPE) == VT_FLOAT) {
      b = 0x6e0f66;
      r = REG_VALUE(r); /* movd */
    } else if ((ft & VT_BTYPE) == VT_DOUBLE) {
      b = 0x7e0ff3; /* movq */
      r = REG_VALUE(r);
    } else if ((ft & VT_BTYPE) == VT_LDOUBLE) {
      b = 0xdb, r = 5; /* fldt */
    } else if ((ft & VT_TYPE) == VT_BYTE || (ft & VT_TYPE) == VT_BOOL) {
      b = 0xbe0f; /* movsbl */
    } else if ((ft & VT_TYPE) == (VT_BYTE | VT_UNSIGNED)) {
      b = 0xb60f; /* movzbl */
    } else if ((ft & VT_TYPE) == VT_SHORT) {
      b = 0xbf0f; /* movswl */
    } else if ((ft & VT_TYPE) == (VT_SHORT | VT_UNSIGNED)) {
      b = 0xb70f; /* movzwl */
    } else {
      assert(((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) ||
             ((ft & VT_BTYPE) == VT_FUNC));
      ll = is64_type(ft);
      b = 0x8b;
    }
    if (ll) {
      gen_modrm64(b, r, fr, sv->sym, fc);
    } else {
      orex(ll, fr, r, b);
      gen_modrm(r, fr, sv->sym, fc);
    }
  } else {
    if (v == VT_CONST) {
      if (fr & VT_SYM) {
#ifdef TCC_TARGET_PE
        orex(1, 0, r, 0x8d);
        o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
        gen_addrpc32(fr, sv->sym, fc);
#else
        if (sv->sym->type.t & VT_STATIC) {
          orex(1, 0, r, 0x8d);
          o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
          gen_addrpc32(fr, sv->sym, fc);
        } else {
          orex(1, 0, r, 0x8b);
          o(0x05 + REG_VALUE(r) * 8); /* mov xx(%rip), r */
          gen_gotpcrel(r, sv->sym, fc);
        }
#endif
      } else if (is64_type(ft)) {
        orex(1, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le64(sv->c.i);
      } else {
        orex(0, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le32(fc);
      }
    } else if (v == VT_LOCAL) {
      orex(1, 0, r, 0x8d); /* lea xxx(%ebp), r */
      gen_modrm(r, VT_LOCAL, sv->sym, fc);
    } else if (v == VT_CMP) {
      orex(0, r, 0, 0);
      if ((fc & ~0x100) != TOK_NE)
        oad(0xb8 + REG_VALUE(r), 0); /* mov $0, r */
      else
        oad(0xb8 + REG_VALUE(r), 1); /* mov $1, r */
      if (fc & 0x100) {
        /* This was a float compare.  If the parity bit is
       set the result was unordered, meaning false for everything
       except TOK_NE, and true for TOK_NE.  */
        fc &= ~0x100;
        o(0x037a + (REX_BASE(r) << 8));
      }
      orex(0, r, 0, 0x0f); /* setxx %br */
      o(fc);
      o(0xc0 + REG_VALUE(r));
    } else if (v == VT_JMP || v == VT_JMPI) {
      t = v & 1;
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t); /* mov $1, r */
      o(0x05eb + (REX_BASE(r) << 8)); /* jmp after */
      gsym(fc);
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t ^ 1); /* mov $0, r */
    } else if (v != r) {
      if ((r >= TREG_XMM0) && (r <= TREG_XMM7)) {
        if (v == TREG_ST0) {
          /* gen_cvt_ftof(VT_DOUBLE); */
          o(0xf0245cdd); /* fstpl -0x10(%rsp) */
          /* movsd -0x10(%rsp),%xmmN */
          o(0x100ff2);
          o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
          o(0xf024);
        } else {
          assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
          if ((ft & VT_BTYPE) == VT_FLOAT) {
            o(0x100ff3);
          } else {
            assert((ft & VT_BTYPE) == VT_DOUBLE);
            o(0x100ff2);
          }
          o(0xc0 + REG_VALUE(v) + REG_VALUE(r) * 8);
        }
      } else if (r == TREG_ST0) {
        assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
        /* gen_cvt_ftof(VT_LDOUBLE); */
        /* movsd %xmmN,-0x10(%rsp) */
        o(0x110ff2);
        o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
        o(0xf024);
        o(0xf02444dd); /* fldl -0x10(%rsp) */
      } else {
        orex(1, r, v, 0x89);
        o(0xc0 + REG_VALUE(r) + REG_VALUE(v) * 8); /* mov v, r */
      }
    }
  }
}